

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utext.cpp
# Opt level: O1

void repTextCopy(UText *ut,int64_t start,int64_t limit,int64_t destIndex,UBool move,
                UErrorCode *status)

{
  long *plVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  UnicodeString local_70;
  
  plVar1 = (long *)ut->context;
  iVar2 = (**(code **)(*plVar1 + 0x40))(plVar1);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    if ((limit < start) || (destIndex < limit && start < destIndex)) {
      *status = U_INDEX_OUTOFBOUNDS_ERROR;
    }
    else {
      uVar7 = (ulong)iVar2;
      uVar4 = start;
      if ((long)uVar7 < start) {
        uVar4 = uVar7;
      }
      uVar4 = uVar4 & 0xffffffff;
      if (start < 0) {
        uVar4 = 0;
      }
      iVar2 = (int)uVar4;
      uVar8 = limit;
      if ((long)uVar7 < limit) {
        uVar8 = uVar7;
      }
      uVar8 = uVar8 & 0xffffffff;
      if (limit < 0) {
        uVar8 = 0;
      }
      if (destIndex <= (long)uVar7) {
        uVar7 = destIndex;
      }
      uVar7 = uVar7 & 0xffffffff;
      if (destIndex < 0) {
        uVar7 = 0;
      }
      iVar5 = (int)uVar8;
      iVar6 = (int)uVar7;
      (**(code **)(*plVar1 + 0x28))(plVar1,uVar4,uVar8,uVar7);
      if (move != '\0') {
        iVar3 = 0;
        if (iVar6 < iVar2) {
          uVar4 = uVar8;
          iVar3 = iVar5 - iVar2;
        }
        iVar5 = iVar3 + iVar5;
        local_70.super_Replaceable.super_UObject._vptr_UObject =
             (UObject)&PTR__UnicodeString_003c0258;
        local_70.fUnion.fStackFields.fLengthAndFlags = 2;
        iVar2 = (int)uVar4;
        (**(code **)(*plVar1 + 0x20))(plVar1,uVar4,iVar5);
        icu_63::UnicodeString::~UnicodeString(&local_70);
      }
      iVar3 = iVar6;
      if (iVar2 < iVar6 && move != '\0') {
        iVar3 = iVar2;
      }
      if ((long)iVar3 < ut->chunkNativeLimit) {
        ut->chunkNativeLimit = 0;
        *(undefined8 *)&ut->nativeIndexingLimit = 0;
        *(undefined8 *)((long)&ut->chunkNativeStart + 4) = 0;
        ut->chunkLength = 0;
      }
      iVar5 = (iVar5 + iVar6) - iVar2;
      if (iVar2 < iVar6 && move != '\0') {
        iVar5 = iVar6;
      }
      repTextAccess(ut,(long)iVar5,'\x01');
    }
  }
  return;
}

Assistant:

static void U_CALLCONV
repTextCopy(UText *ut,
                int64_t start, int64_t limit,
                int64_t destIndex,
                UBool move,
                UErrorCode *status)
{
    Replaceable *rep=(Replaceable *)ut->context;
    int32_t length=rep->length();

    if(U_FAILURE(*status)) {
        return;
    }
    if (start>limit || (start<destIndex && destIndex<limit))
    {
        *status=U_INDEX_OUTOFBOUNDS_ERROR;
        return;
    }

    int32_t start32     = pinIndex(start, length);
    int32_t limit32     = pinIndex(limit, length);
    int32_t destIndex32 = pinIndex(destIndex, length);

    // TODO:  snap input parameters to code point boundaries.

    if(move) {
        // move: copy to destIndex, then replace original with nothing
        int32_t segLength=limit32-start32;
        rep->copy(start32, limit32, destIndex32);
        if(destIndex32<start32) {
            start32+=segLength;
            limit32+=segLength;
        }
        rep->handleReplaceBetween(start32, limit32, UnicodeString());
    } else {
        // copy
        rep->copy(start32, limit32, destIndex32);
    }

    // If the change to the text touched the region in the chunk buffer,
    //  invalidate the buffer.
    int32_t firstAffectedIndex = destIndex32;
    if (move && start32<firstAffectedIndex) {
        firstAffectedIndex = start32;
    }
    if (firstAffectedIndex < ut->chunkNativeLimit) {
        // changes may have affected range covered by the chunk
        invalidateChunk(ut);
    }

    // Put iteration position at the newly inserted (moved) block,
    int32_t  nativeIterIndex = destIndex32 + limit32 - start32;
    if (move && destIndex32>start32) {
        // moved a block of text towards the end of the string.
        nativeIterIndex = destIndex32;
    }

    // Set position, reload chunk if needed.
    repTextAccess(ut, nativeIterIndex, TRUE);
}